

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

int Ga2_ObjSatValue(Ga2_Man_t *p,Gia_Obj_t *pObj,int f)

{
  sat_solver2 *s;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int Lit;
  int f_local;
  Gia_Obj_t *pObj_local;
  Ga2_Man_t *p_local;
  
  iVar1 = Ga2_ObjFindLit(p,pObj,f);
  iVar2 = Gia_ObjIsConst0(pObj);
  if (iVar2 == 0) {
    if (iVar1 == -1) {
      p_local._4_4_ = 0;
    }
    else {
      iVar2 = Abc_Lit2Var(iVar1);
      if (iVar2 < p->pSat->size) {
        uVar3 = Abc_LitIsCompl(iVar1);
        s = p->pSat;
        iVar1 = Abc_Lit2Var(iVar1);
        uVar4 = sat_solver2_var_value(s,iVar1);
        p_local._4_4_ = uVar3 ^ uVar4;
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    return p_local._4_4_;
  }
  __assert_fail("!Gia_ObjIsConst0(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                ,0x487,"int Ga2_ObjSatValue(Ga2_Man_t *, Gia_Obj_t *, int)");
}

Assistant:

static inline int Ga2_ObjSatValue( Ga2_Man_t * p, Gia_Obj_t * pObj, int f )
{
    int Lit = Ga2_ObjFindLit( p, pObj, f );
    assert( !Gia_ObjIsConst0(pObj) );
    if ( Lit == -1 )
        return 0;
    if ( Abc_Lit2Var(Lit) >= p->pSat->size )
        return 0;
    return Abc_LitIsCompl(Lit) ^ sat_solver2_var_value( p->pSat, Abc_Lit2Var(Lit) );
}